

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.h
# Opt level: O0

bool __thiscall
JsUtil::CircularBuffer<Js::EvalMapStringInternal<false>,_15U,_Memory::Recycler>::Contains
          (CircularBuffer<Js::EvalMapStringInternal<false>,_15U,_Memory::Recycler> *this,
          EvalMapStringInternal<false> *value)

{
  bool bVar1;
  uint uVar2;
  uint local_24;
  uint i;
  EvalMapStringInternal<false> *value_local;
  CircularBuffer<Js::EvalMapStringInternal<false>,_15U,_Memory::Recycler> *this_local;
  
  local_24 = 0;
  while( true ) {
    uVar2 = GetMaxIndex(this);
    if (uVar2 <= local_24) {
      return false;
    }
    bVar1 = DefaultComparer<Js::EvalMapStringInternal<false>_>::Equals
                      (this->entries + local_24,value);
    if (bVar1) break;
    local_24 = local_24 + 1;
  }
  return true;
}

Assistant:

bool Contains(const T& value)
        {
            for (uint i = 0; i < GetMaxIndex(); i++)
            {
                if (DefaultComparer<T>::Equals(entries[i], value))
                {
                    return true;
                }
            }

            return false;
        }